

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moveGeneration.cpp
# Opt level: O1

void possibleMovesRooks(U64 rBoard,U64 FriendlyPieces,U64 EnemyPieces,castleBools castleInfo,
                       bool black,arrayMoveList *possibleMoves)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  byte end;
  ulong uVar4;
  ulong uVar5;
  byte start;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar8 = EnemyPieces | FriendlyPieces;
  if (rBoard != 0) {
    do {
      lVar1 = 0;
      if (rBoard != 0) {
        for (; (rBoard >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      uVar2 = (uint)lVar1 ^ 0x3f;
      uVar3 = *(ulong *)((long)RayTable[0] + (ulong)(uVar2 << 6));
      uVar4 = uVar3 & uVar8;
      if (uVar4 != 0) {
        lVar1 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        uVar3 = uVar3 ^ *(ulong *)((long)RayTable[0] + (ulong)(((uint)lVar1 ^ 0x3f) << 6));
      }
      uVar4 = *(ulong *)((long)RayTable[0] + (ulong)(uVar2 << 6) + 0x18);
      uVar5 = uVar4 & uVar8;
      if (uVar5 != 0) {
        lVar1 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        uVar4 = uVar4 ^ *(ulong *)((long)RayTable[0] + (ulong)(((uint)lVar1 ^ 0x3f) << 6) + 0x18);
      }
      uVar5 = *(ulong *)((long)RayTable[0] + (ulong)(uVar2 << 6) + 0x20);
      uVar6 = uVar5 & uVar8;
      if (uVar6 != 0) {
        lVar1 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar5 = uVar5 ^ *(ulong *)((long)RayTable[0] + (ulong)(((uint)lVar1 ^ 0x3f) << 6) + 0x20);
      }
      uVar6 = *(ulong *)((long)RayTable[0] + (ulong)(uVar2 << 6) + 0x28);
      uVar7 = uVar6 & uVar8;
      if (uVar7 != 0) {
        lVar1 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar6 = uVar6 ^ *(ulong *)((long)RayTable[0] + (ulong)(((uint)lVar1 ^ 0x3f) << 6) + 0x28);
      }
      for (uVar3 = (uVar4 | uVar3 | uVar5 | uVar6) & ~FriendlyPieces; uVar3 != 0;
          uVar3 = uVar3 & uVar3 - 1) {
        lVar1 = 0;
        if (uVar3 != 0) {
          for (; (uVar3 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        arrayMoveList::create(possibleMoves,(byte)uVar2,(byte)lVar1 ^ 0x3f,'\0');
      }
      rBoard = rBoard & rBoard - 1;
    } while (rBoard != 0);
  }
  if (black) {
    if ((uVar8 & 0x7000000000000000) == 0 && ((uint)castleInfo >> 0x10 & 1) != 0) {
      arrayMoveList::create(possibleMoves,'\x04','\x02','\x01');
    }
    if ((uVar8 & 0x600000000000000) != 0 || ((uint)castleInfo >> 0x18 & 1) == 0) {
      return;
    }
    start = '\x04';
    end = '\x06';
  }
  else {
    if ((uVar8 & 0x70) == 0 && (~castleInfo.whiteACan & 1U) == 0) {
      arrayMoveList::create(possibleMoves,'<',':','\x01');
    }
    if ((uVar8 & 6) != 0 || ((uint)castleInfo >> 8 & 1) == 0) {
      return;
    }
    start = '<';
    end = '>';
  }
  arrayMoveList::create(possibleMoves,start,end,'\x01');
  return;
}

Assistant:

void possibleMovesRooks(const U64 rBoard, const U64 FriendlyPieces, const U64 EnemyPieces, castleBools castleInfo, bool black, arrayMoveList& possibleMoves) {
  U64 pieces = rBoard;

  const U64 occupied = FriendlyPieces | EnemyPieces;

  while(pieces) {
    int square = bitPop(pieces);
    U64 attacks = 0ULL;

    attacks |= getNegativeRayAttacks(occupied, FriendlyPieces, 0, square);
    attacks |= getNegativeRayAttacks(occupied, FriendlyPieces, 3, square);
    attacks |= getPositiveRayAttacks(occupied, FriendlyPieces, 4, square);
    attacks |= getPositiveRayAttacks(occupied, FriendlyPieces, 5, square);

    while(attacks) {
      int j = bitPop(attacks);
      possibleMoves.create(square, j);
    }
  }

	if(black) {
		if(castleInfo.blackACan) {
			if(!(8070450532247928832ULL & (FriendlyPieces | EnemyPieces) )) // Checks for pieces between the rook and king
				possibleMoves.create(4, 2, 1);
		}
		if(castleInfo.blackHCan) {
			if(!(432345564227567616ULL & (FriendlyPieces | EnemyPieces) ))
				possibleMoves.create(4, 6, 1);
		}
	} else {
		if(castleInfo.whiteACan) {
			if(!(112ULL & (FriendlyPieces | EnemyPieces) ))
				possibleMoves.create(60, 58, 1);
		}
		if(castleInfo.whiteHCan) {
			if(!(6ULL & (FriendlyPieces | EnemyPieces) ))
				possibleMoves.create(60, 62, 1);
		}
	}
}